

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ListColumnData::Append
          (ListColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  sel_t *psVar1;
  byte bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  pointer pCVar6;
  undefined4 extraout_var;
  type puVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  Vector *other;
  BaseStatistics *pBVar9;
  reference pvVar10;
  idx_t idx_in_entry;
  ulong __i;
  idx_t iVar11;
  long lVar12;
  idx_t iVar13;
  ulong uVar14;
  long lVar15;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true> append_offsets;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat list_data;
  Vector child_vector;
  idx_t local_190;
  _Head_base<0UL,_unsigned_long_*,_false> local_188;
  ColumnAppendState *local_180;
  _Head_base<0UL,_unsigned_long_*,_false> local_178;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_170;
  SelectionVector *local_160;
  long local_150;
  BaseStatistics *local_148;
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *local_140;
  Vector *local_138;
  ListColumnData *local_130;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_90 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_180 = state;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  local_138 = vector;
  Vector::ToUnifiedFormat(vector,count,&local_e0);
  local_140 = &this->child_column;
  pCVar6 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (local_140);
  iVar5 = (*pCVar6->_vptr_ColumnData[3])();
  local_150 = CONCAT44(extraout_var,iVar5);
  local_178._M_head_impl = (unsigned_long *)0x0;
  sStack_170.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sStack_170.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160 = (SelectionVector *)count;
  local_188._M_head_impl = (unsigned_long *)operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8)
  ;
  if (count == 0) {
    bVar4 = true;
    local_190 = 0;
  }
  else {
    bVar4 = true;
    local_190 = 0;
    __i = 0;
    local_148 = stats;
    local_130 = this;
    do {
      uVar14 = __i;
      if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
        uVar14 = (ulong)(local_e0.sel)->sel_vector[__i];
      }
      if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
           >> (uVar14 & 0x3f) & 1) != 0)) {
        lVar15 = uVar14 * 0x10;
        iVar11 = *(idx_t *)(local_e0.data + lVar15);
        lVar12 = *(long *)(local_e0.data + lVar15 + 8);
        puVar7 = unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>
                             *)&local_188,__i);
        if (iVar11 != local_190) {
          bVar4 = false;
        }
        *puVar7 = lVar12 + local_150 + local_190;
        local_190 = local_190 + *(long *)(local_e0.data + lVar15 + 8);
        this = local_130;
      }
      else {
        if (local_178._M_head_impl == (unsigned_long *)0x0) {
          local_128.sel = local_160;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_98,(unsigned_long *)&local_128);
          p_Var3 = ap_Stack_90[0];
          sStack_170.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_98;
          this_00._M_pi =
               sStack_170.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_98 = (undefined1  [8])0x0;
          ap_Stack_90[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sStack_170.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var3;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          }
          if (ap_Stack_90[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_90[0]);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&sStack_170);
          local_178._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar2 = (byte)__i & 0x3f;
        local_178._M_head_impl[__i >> 6] =
             local_178._M_head_impl[__i >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2)
        ;
        puVar7 = unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>
                             *)&local_188,__i);
        *puVar7 = local_190 + local_150;
      }
      __i = __i + 1;
      stats = local_148;
    } while (count != __i);
  }
  other = ListVector::GetEntry(local_138);
  Vector::Vector((Vector *)local_98,other);
  if (!bVar4) {
    SelectionVector::SelectionVector((SelectionVector *)&local_128,local_190);
    if (count != 0) {
      psVar1 = (local_e0.sel)->sel_vector;
      iVar11 = 0;
      lVar12 = 0;
      do {
        iVar13 = iVar11;
        if (psVar1 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar1[iVar11];
        }
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar13 >> 6]
             >> (iVar13 & 0x3f) & 1) != 0)) {
          lVar15 = *(long *)(local_e0.data + iVar13 * 0x10 + 8);
          if (lVar15 != 0) {
            iVar5 = *(int *)(local_e0.data + iVar13 * 0x10);
            do {
              *(int *)((long)&(local_128.sel)->sel_vector + lVar12 * 4) = iVar5;
              lVar12 = lVar12 + 1;
              iVar5 = iVar5 + 1;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != count);
    }
    Vector::Slice((Vector *)local_98,other,(SelectionVector *)&local_128,local_190);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
    }
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  local_128.sel = FlatVector::IncrementalSelectionVector();
  local_128.data = (data_ptr_t)local_188._M_head_impl;
  if (local_190 != 0) {
    pCVar6 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(local_140);
    pBVar9 = ListStats::GetChildStats(stats);
    pvVar10 = vector<duckdb::ColumnAppendState,_true>::operator[](&local_180->child_appends,1);
    (*pCVar6->_vptr_ColumnData[0x12])(pCVar6,pBVar9,pvVar10,local_98,local_190);
  }
  ColumnData::AppendData(&this->super_ColumnData,stats,local_180,&local_128,count);
  local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       local_178._M_head_impl;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data,
             &sStack_170);
  local_128.validity.super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_160;
  pvVar10 = vector<duckdb::ColumnAppendState,_true>::operator[](&local_180->child_appends,0);
  ValidityColumnData::AppendData(&this->validity,stats,pvVar10,&local_128,count);
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)ap_Stack_90);
  if (local_188._M_head_impl != (unsigned_long *)0x0) {
    operator_delete__(local_188._M_head_impl);
  }
  if (sStack_170.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_170.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ListColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	D_ASSERT(count > 0);
	UnifiedVectorFormat list_data;
	vector.ToUnifiedFormat(count, list_data);
	auto &list_validity = list_data.validity;

	// construct the list_entry_t entries to append to the column data
	auto input_offsets = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	auto start_offset = child_column->GetMaxEntry();
	idx_t child_count = 0;

	ValidityMask append_mask(count);
	auto append_offsets = unique_ptr<uint64_t[]>(new uint64_t[count]);
	bool child_contiguous = true;
	for (idx_t i = 0; i < count; i++) {
		auto input_idx = list_data.sel->get_index(i);
		if (list_validity.RowIsValid(input_idx)) {
			auto &input_list = input_offsets[input_idx];
			if (input_list.offset != child_count) {
				child_contiguous = false;
			}
			append_offsets[i] = start_offset + child_count + input_list.length;
			child_count += input_list.length;
		} else {
			append_mask.SetInvalid(i);
			append_offsets[i] = start_offset + child_count;
		}
	}
	auto &list_child = ListVector::GetEntry(vector);
	Vector child_vector(list_child);
	if (!child_contiguous) {
		// if the child of the list vector is a non-contiguous vector (i.e. list elements are repeating or have gaps)
		// we first push a selection vector and flatten the child vector to turn it into a contiguous vector
		SelectionVector child_sel(child_count);
		idx_t current_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto input_idx = list_data.sel->get_index(i);
			if (list_validity.RowIsValid(input_idx)) {
				auto &input_list = input_offsets[input_idx];
				for (idx_t list_idx = 0; list_idx < input_list.length; list_idx++) {
					child_sel.set_index(current_count++, input_list.offset + list_idx);
				}
			}
		}
		D_ASSERT(current_count == child_count);
		child_vector.Slice(list_child, child_sel, child_count);
	}

	UnifiedVectorFormat vdata;
	vdata.sel = FlatVector::IncrementalSelectionVector();
	vdata.data = data_ptr_cast(append_offsets.get());

	// append the child vector
	if (child_count > 0) {
		child_column->Append(ListStats::GetChildStats(stats), state.child_appends[1], child_vector, child_count);
	}
	// append the list offsets
	ColumnData::AppendData(stats, state, vdata, count);
	// append the validity data
	vdata.validity = append_mask;
	validity.AppendData(stats, state.child_appends[0], vdata, count);
}